

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_SetGamepadMode
               (ImGui_ImplSDL2_GamepadMode mode,_SDL_GameController **manual_gamepads_array,
               int manual_gamepads_count)

{
  ImGui_ImplSDL2_Data *pIVar1;
  ulong uVar2;
  bool bVar3;
  
  pIVar1 = ImGui_ImplSDL2_GetBackendData();
  ImGui_ImplSDL2_CloseGamepads();
  if (mode == ImGui_ImplSDL2_GamepadMode_Manual) {
    uVar2 = 0;
    if (0 < manual_gamepads_count) {
      uVar2 = (ulong)(uint)manual_gamepads_count;
    }
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      ImVector<_SDL_GameController_*>::push_back(&pIVar1->Gamepads,manual_gamepads_array);
      manual_gamepads_array = manual_gamepads_array + 1;
    }
  }
  else {
    pIVar1->WantUpdateGamepadsList = true;
  }
  pIVar1->GamepadMode = mode;
  return;
}

Assistant:

void ImGui_ImplSDL2_SetGamepadMode(ImGui_ImplSDL2_GamepadMode mode, struct _SDL_GameController** manual_gamepads_array, int manual_gamepads_count)
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    ImGui_ImplSDL2_CloseGamepads();
    if (mode == ImGui_ImplSDL2_GamepadMode_Manual)
    {
        IM_ASSERT(manual_gamepads_array != nullptr && manual_gamepads_count > 0);
        for (int n = 0; n < manual_gamepads_count; n++)
            bd->Gamepads.push_back(manual_gamepads_array[n]);
    }
    else
    {
        IM_ASSERT(manual_gamepads_array == nullptr && manual_gamepads_count <= 0);
        bd->WantUpdateGamepadsList = true;
    }
    bd->GamepadMode = mode;
}